

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_port.h
# Opt level: O3

void __thiscall
sc_core::sc_port<sc_core::sc_signal_in_if<bool>,_1,_(sc_core::sc_port_policy)0>::sc_port
          (sc_port<sc_core::sc_signal_in_if<bool>,_1,_(sc_core::sc_port_policy)0> *this,char *name_,
          sc_signal_in_if<bool> *interface_)

{
  socklen_t __len;
  sockaddr *__addr;
  
  __len = 0;
  sc_port_base::sc_port_base((sc_port_base *)this,name_,1,SC_ONE_OR_MORE_BOUND);
  (this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>).m_interface_vec.
  super__Vector_base<sc_core::sc_signal_in_if<bool>_*,_std::allocator<sc_core::sc_signal_in_if<bool>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>).m_interface_vec.
  super__Vector_base<sc_core::sc_signal_in_if<bool>_*,_std::allocator<sc_core::sc_signal_in_if<bool>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>).m_interface =
       (sc_signal_in_if<bool> *)0x0;
  (this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>).m_interface_vec.
  super__Vector_base<sc_core::sc_signal_in_if<bool>_*,_std::allocator<sc_core::sc_signal_in_if<bool>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_sc_port_b<sc_core::sc_signal_in_if<bool>_>).super_sc_port_base.super_sc_object.
  _vptr_sc_object = (_func_int **)&PTR_print_0026a848;
  sc_warn_port_constructor();
  sc_port_base::bind((sc_port_base *)this,
                     (int)interface_ + (int)*(undefined8 *)((long)*interface_ + -0x30),__addr,__len)
  ;
  return;
}

Assistant:

sc_port( const char* name_, IF& interface_ )
	: base_type( name_, N, P )
	{ sc_warn_port_constructor(); base_type::bind( interface_ ); }